

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O0

int __thiscall
rudp::rudp_server::connect(rudp_server *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  io_service *ios;
  __shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *this_00;
  function<void_(bool,_unsigned_int)> *endpoint_;
  bool bVar1;
  int extraout_EAX;
  session *this_01;
  element_type *this_02;
  socklen_t __len_00;
  undefined4 in_register_0000000c;
  element_type *peVar2;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  anon_class_72_3_4357acd4 local_f0;
  function<void_(bool,_unsigned_int)> local_a8;
  undefined1 local_85;
  anon_class_40_2_a03751d3 local_78;
  function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> local_50;
  __shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *local_30;
  mapped_type *sess;
  function<void_()> *on_close_local;
  function<void_(bool,_unsigned_int)> *cb_local;
  endpoint *endpoint_local;
  rudp_server *this_local;
  
  cb_local = (function<void_(bool,_unsigned_int)> *)CONCAT44(in_register_00000034,__fd);
  sess = (mapped_type *)CONCAT44(in_register_0000000c,__len);
  on_close_local = (function<void_()> *)__addr;
  endpoint_local = (endpoint *)this;
  local_30 = &std::
              map<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
              ::operator[](&this->sessions,(key_type *)cb_local)->
              super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  this_00 = local_30;
  if (!bVar1) {
    this_01 = (session *)operator_new(0x5930);
    endpoint_ = cb_local;
    local_85 = 1;
    ios = this->io_service;
    local_78.this = this;
    std::function<void_()>::function(&local_78.on_close,(function<void_()> *)sess);
    std::function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)>::
    function<rudp::rudp_server::connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)::_lambda(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)_1_,void>
              ((function<void(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)> *)
               &local_50,&local_78);
    session::session(this_01,ios,&this->socket,(endpoint *)endpoint_,&local_50);
    local_85 = 0;
    std::__shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>::reset<rudp::session>
              (this_00,this_01);
    std::function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)>::~function
              (&local_50);
    connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)
    ::{lambda(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&)#1}::~function
              ((_lambda_boost__asio__ip__basic_endpoint<boost::asio::ip::udp>const___1_ *)&local_78)
    ;
  }
  this_02 = std::__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rudp::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_30);
  peVar2 = this_02;
  local_f0.this = this;
  std::function<void_(bool,_unsigned_int)>::function
            (&local_f0.cb,(function<void_(bool,_unsigned_int)> *)on_close_local);
  __len_00 = (socklen_t)peVar2;
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_f0.endpoint,(basic_endpoint<boost::asio::ip::udp> *)cb_local);
  std::function<void(bool,unsigned_int)>::
  function<rudp::rudp_server::connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)::_lambda(bool,unsigned_int)_1_,void>
            ((function<void(bool,unsigned_int)> *)&local_a8,&local_f0);
  session::connect(this_02,(int)&local_a8,__addr_00,__len_00);
  std::function<void_(bool,_unsigned_int)>::~function(&local_a8);
  connect(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,std::function<void(bool,unsigned_int)>const&,std::function<void()>const&)
  ::{lambda(bool,unsigned_int)#1}::~function((_lambda_bool_unsigned_int__1_ *)&local_f0);
  return extraout_EAX;
}

Assistant:

void connect(
    const boost::asio::ip::udp::endpoint &endpoint,
    const std::function< void( bool, uint32_t ) > &cb,
    const std::function< void() > &on_close
  ) {
	   auto &sess = sessions[ endpoint ];
	   if( !sess ) sess.reset( new session( io_service, socket, endpoint, [this,on_close]( const boost::asio::ip::udp::endpoint &endpoint ) {
      auto s = sessions.find( endpoint );
      if( s != sessions.end() ) {
        session_bindings.erase( s->second->get_self_config().connection_identifier );
        sessions.erase( s );
        on_close();
      }
    } ) );
    sess->connect( [this,cb,endpoint]( bool status, uint32_t identifier ) {
      session_bindings.insert( std::make_pair( identifier, endpoint ) );
      cb( status, identifier );
    } );
  }